

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O3

Var JSON::Parse(JavascriptString *input,RecyclableObject *reviver,ScriptContext *scriptContext)

{
  PropertyId propertyId;
  bool bVar1;
  LazyJSONString *this;
  Var newValue;
  DynamicObject *instance;
  PropertyRecord *pPVar2;
  JavascriptString *name;
  undefined1 local_d8 [8];
  JSONParser parser;
  
  parser.m_token.u.field_0.length = 0x90;
  JSONScanner::JSONScanner((JSONScanner *)&parser.m_token.tk);
  parser.reviver = (RecyclableObject *)0x0;
  parser.arenaAllocatorObject = (TempGuestArenaAllocatorObject *)0x0;
  parser.arenaAllocator = (ArenaAllocator *)0x0;
  parser.m_scanner._96_8_ = scriptContext;
  parser.scriptContext = (ScriptContext *)reviver;
  bVar1 = Js::VarIsImpl<Js::LazyJSONString>(&input->super_RecyclableObject);
  if (bVar1) {
    this = Js::UnsafeVarTo<Js::LazyJSONString,Js::JavascriptString>(input);
    if (this != (LazyJSONString *)0x0) {
      newValue = Js::LazyJSONString::TryParse(this);
      if (newValue != (Var)0x0) goto LAB_00b60892;
    }
  }
  newValue = JSONParser::Parse((JSONParser *)local_d8,input);
LAB_00b60892:
  if (DAT_0159ef84 == '\x01') {
    Memory::Recycler::CollectNow<(Memory::CollectionFlags)16384>(scriptContext->recycler);
  }
  if (reviver != (RecyclableObject *)0x0) {
    instance = Js::JavascriptLibrary::CreateObject
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
    pPVar2 = ThreadContext::GetEmptyStringPropertyRecord(scriptContext->threadContext);
    propertyId = pPVar2->pid;
    Js::JavascriptOperators::InitProperty
              (&instance->super_RecyclableObject,propertyId,newValue,PropertyOperation_None);
    name = Js::JavascriptLibrary::GetEmptyString
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    newValue = JSONParser::Walk((JSONParser *)local_d8,name,propertyId,instance,0xffffffff);
  }
  JSONParser::Finalizer((JSONParser *)local_d8);
  return newValue;
}

Assistant:

Js::Var Parse(Js::JavascriptString* input, Js::RecyclableObject* reviver, Js::ScriptContext* scriptContext)
    {
        // alignment required because of the union in JSONParser::m_token
        __declspec (align(8)) JSONParser parser(scriptContext, reviver);
        Js::Var result = NULL;

        TryFinally([&]()
        {
            LazyJSONString* lazyString = JavascriptOperators::TryFromVar<LazyJSONString>(input);
            if (lazyString)
            {
                // Try to reconstruct object based on the data collected during stringify
                // In case of semantically important gap, this call may fail and we will need to do real parse
                result = lazyString->TryParse();
            }
            if (result == nullptr)
            {
                result = parser.Parse(input);
            }

    #ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceGCAfterJSONParse))
            {
                Recycler* recycler = scriptContext->GetRecycler();
                recycler->CollectNow<CollectNowForceInThread>();
            }
    #endif

            if (reviver)
            {
                Js::DynamicObject* root = scriptContext->GetLibrary()->CreateObject();
                JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(root));
                Js::PropertyId propertyId = scriptContext->GetEmptyStringPropertyId();
                Js::JavascriptOperators::InitProperty(root, propertyId, result);
                result = parser.Walk(scriptContext->GetLibrary()->GetEmptyString(), propertyId, root);
            }
        },
            [&](bool/*hasException*/)
        {
            parser.Finalizer();
        });

        return result;
    }